

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint *puVar6;
  char **ppcVar7;
  ATTRIBUTE *pAVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  long lVar11;
  int iVar12;
  byte *pbVar13;
  byte *pbVar14;
  uint uVar10;
  
  if (end <= ptr) {
    return -4;
  }
  bVar3 = false;
  iVar4 = 0;
  iVar12 = 0x12;
  lVar11 = 1;
  puVar6 = &switchD_005fde7f::switchdataD_007c72b0;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -1;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    switch(bVar2) {
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      iVar4 = normal_scanDecl(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      goto switchD_005fe36c_caseD_11;
    case 0x16:
    case 0x18:
switchD_005fe36c_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar2 - 5 < 3) || (bVar2 == 0x1d)) goto switchD_005fe36c_caseD_16;
switchD_005fe36c_caseD_11:
      *nextTokPtr = (char *)pbVar13;
    }
    goto LAB_005fe61c;
  default:
    *nextTokPtr = ptr;
    break;
  case 4:
    pcVar5 = ptr + 1;
    if ((long)end - (long)pcVar5 < 1) {
      iVar4 = -0x1a;
    }
    else {
      if (*pcVar5 == ']') {
        if ((long)end - (long)pcVar5 == 1) {
          return -1;
        }
        if (ptr[2] == '>') {
          *nextTokPtr = ptr + 3;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar5;
      iVar4 = 0x1a;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 != 0) goto LAB_005fe1dc;
    iVar4 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_02,(char **)puVar6);
    lVar11 = 2;
    if (iVar4 != 0) goto LAB_005fe3e9;
    iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_03,(char **)puVar6);
LAB_005fe60d:
    if (iVar4 != 0) goto switchD_005fde7f_caseD_19;
switchD_005fdec8_caseD_8:
    *nextTokPtr = ptr;
    goto LAB_005fe61c;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar5 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar5 == 0) {
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_06,(char **)puVar6);
      lVar11 = 3;
      if (iVar4 == 0) {
        iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_08,(char **)puVar6);
        goto LAB_005fe60d;
      }
LAB_005fe3e9:
      bVar3 = false;
switchD_005fde7f_caseD_16:
      ptr = ptr + lVar11;
      do {
        lVar11 = (long)end - (long)ptr;
        if (lVar11 < 1) {
          return -iVar12;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar9 = uVar10 - 5;
        if (0x1f < uVar9) goto switchD_005fdec8_caseD_8;
        ppcVar7 = (char **)&DAT_00000001;
        switch(uVar10) {
        case 5:
          if (lVar11 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].nameLength)(enc,ptr);
          if (iVar4 != 0) goto switchD_005fdec8_caseD_8;
          iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX,ppcVar7);
          ppcVar7 = (char **)&DAT_00000002;
          break;
        case 6:
          if (lVar11 < 3) {
            return -2;
          }
          pcVar5 = (*enc[3].skipS)(enc,ptr);
          if ((int)pcVar5 != 0) goto switchD_005fdec8_caseD_8;
          iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcVar7);
          ppcVar7 = (char **)0x3;
          break;
        case 7:
          if (lVar11 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].getAtts)(enc,ptr,(&switchD_005fdec8::switchdataD_007c733c)[uVar9] +
                                            0x7c733c,(ATTRIBUTE *)&DAT_00000001);
          if (iVar4 != 0) goto switchD_005fdec8_caseD_8;
          iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar7);
          ppcVar7 = (char **)0x4;
          break;
        default:
          goto switchD_005fdec8_caseD_8;
        case 9:
        case 10:
        case 0xb:
        case 0x14:
        case 0x15:
        case 0x1e:
        case 0x20:
        case 0x23:
        case 0x24:
          *nextTokPtr = ptr;
          return iVar12;
        case 0xf:
          if (!bVar3) {
            *nextTokPtr = (char *)((byte *)ptr + 1);
            return 0x1e;
          }
          goto switchD_005fdec8_caseD_8;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_005fdec8_caseD_16;
        case 0x21:
          if (!bVar3) {
            *nextTokPtr = (char *)((byte *)ptr + 1);
            return 0x1f;
          }
          goto switchD_005fdec8_caseD_8;
        case 0x22:
          if (!bVar3) {
            *nextTokPtr = (char *)((byte *)ptr + 1);
            return 0x20;
          }
          goto switchD_005fdec8_caseD_8;
        }
        if (iVar4 == 0) goto switchD_005fdec8_caseD_8;
switchD_005fdec8_caseD_16:
        ptr = (char *)((byte *)ptr + (long)ppcVar7);
      } while( true );
    }
    goto LAB_005fe1dc;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)&switchD_005fde7f::switchdataD_007c72b0)
    ;
    if (iVar4 == 0) {
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_04,(char *)puVar6);
      lVar11 = 4;
      if (iVar4 == 0) {
        iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_05,(char **)puVar6);
        goto LAB_005fe60d;
      }
      goto LAB_005fe3e9;
    }
LAB_005fe1dc:
    *nextTokPtr = ptr;
    goto LAB_005fe61c;
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar13 = (byte *)(ptr + 1);
    lVar11 = (long)end - (long)pbVar13;
    pbVar14 = pbVar13;
    for (; (0 < lVar11 &&
           (((cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar13), cVar1 == '\x15' ||
             (cVar1 == '\n')) ||
            ((pbVar14 = pbVar13, cVar1 == '\t' && (pbVar13 + 1 != (byte *)end))))));
        pbVar13 = pbVar13 + 1) {
      lVar11 = lVar11 + -1;
      pbVar14 = (byte *)end;
    }
    *nextTokPtr = (char *)pbVar14;
    iVar4 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x11;
    break;
  case 0xc:
    iVar4 = 0xc;
    goto LAB_005fe0ec;
  case 0xd:
    iVar4 = 0xd;
LAB_005fe0ec:
    iVar4 = normal_scanLit(iVar4,enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x13:
    pbVar13 = (byte *)(ptr + 1);
    lVar11 = (long)end - (long)pbVar13;
    if (lVar11 < 1) {
      return -1;
    }
    pAVar8 = (ATTRIBUTE *)(ulong)*pbVar13;
    bVar2 = *(byte *)((long)&pAVar8->name + (long)enc[1].scanners);
    if (bVar2 < 0x16) {
      if (bVar2 == 5) {
        if (lVar11 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar13);
        if (iVar4 == 0) {
          iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar13,extraout_RDX_09,&pAVar8->name);
          lVar11 = 3;
LAB_005fe4b9:
          if (iVar4 != 0) {
LAB_005fe4c1:
            ptr = ptr + lVar11;
            do {
              lVar11 = (long)end - (long)ptr;
              if (lVar11 < 1) {
                return -0x14;
              }
              uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
              uVar9 = uVar10 - 5;
              if (0x1f < uVar9) goto switchD_005fdec8_caseD_8;
              ppcVar7 = (char **)&DAT_00000001;
              switch(uVar10) {
              case 5:
                if (lVar11 == 1) {
                  return -2;
                }
                iVar4 = (*enc[3].nameLength)(enc,ptr);
                if (iVar4 != 0) goto switchD_005fdec8_caseD_8;
                iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_11,ppcVar7);
                ppcVar7 = (char **)&DAT_00000002;
                break;
              case 6:
                if (lVar11 < 3) {
                  return -2;
                }
                pcVar5 = (*enc[3].skipS)(enc,ptr);
                if ((int)pcVar5 != 0) goto switchD_005fdec8_caseD_8;
                iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_13,ppcVar7);
                ppcVar7 = (char **)0x3;
                break;
              case 7:
                if (lVar11 < 4) {
                  return -2;
                }
                iVar4 = (*enc[3].getAtts)(enc,ptr,(&switchD_005fe504::switchdataD_007c73bc)[uVar9] +
                                                  0x7c73bc,(ATTRIBUTE *)&DAT_00000001);
                if (iVar4 != 0) goto switchD_005fdec8_caseD_8;
                iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_12,ppcVar7);
                ppcVar7 = (char **)0x4;
                break;
              default:
                goto switchD_005fdec8_caseD_8;
              case 9:
              case 10:
              case 0xb:
              case 0x15:
              case 0x1e:
              case 0x20:
              case 0x24:
                *nextTokPtr = ptr;
                return 0x14;
              case 0x16:
              case 0x18:
              case 0x19:
              case 0x1a:
              case 0x1b:
                goto switchD_005fe504_caseD_16;
              }
              if (iVar4 == 0) goto switchD_005fdec8_caseD_8;
switchD_005fe504_caseD_16:
              ptr = (char *)((byte *)ptr + (long)ppcVar7);
            } while( true );
          }
        }
      }
      else if (bVar2 == 6) {
        if (lVar11 < 3) {
          return -2;
        }
        pcVar5 = (*enc[3].skipS)(enc,(char *)pbVar13);
        if ((int)pcVar5 == 0) {
          iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar13,extraout_RDX_10,&pAVar8->name);
          lVar11 = 4;
          goto LAB_005fe4b9;
        }
      }
      else if (bVar2 == 7) {
        if (lVar11 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar13,7,pAVar8);
        if (iVar4 == 0) {
          iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar13,extraout_RDX_07,(char *)pAVar8);
          lVar11 = 5;
          goto LAB_005fe4b9;
        }
      }
    }
    else {
      lVar11 = 2;
      if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_005fe4c1;
    }
    *nextTokPtr = (char *)pbVar13;
LAB_005fe61c:
    iVar4 = 0;
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_005fde7f_caseD_16;
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_005fde7f_caseD_19:
    iVar12 = 0x13;
    bVar3 = true;
    goto switchD_005fde7f_caseD_16;
  case 0x1e:
    iVar4 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x17;
    break;
  case 0x20:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -0x18;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    if (bVar2 < 0x20) {
      if (2 < bVar2 - 9) {
        if (bVar2 == 0xf) {
          *nextTokPtr = ptr + 2;
          return 0x23;
        }
        if (bVar2 != 0x15) goto switchD_005fe3bf_default;
      }
switchD_005fe3bf_caseD_20:
      *nextTokPtr = (char *)pbVar13;
      iVar4 = 0x18;
    }
    else {
      switch(bVar2) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_005fe3bf_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 2;
        iVar4 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 2;
        iVar4 = 0x25;
        break;
      default:
switchD_005fe3bf_default:
        *nextTokPtr = (char *)pbVar13;
        goto LAB_005fe61c;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x15;
  }
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr) {
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT: {
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_EXCL:
      return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_QUEST:
      return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_NMSTRT:
    case BT_HEX:
    case BT_NONASCII:
    case BT_LEAD2:
    case BT_LEAD3:
    case BT_LEAD4:
      *nextTokPtr = ptr - MINBPC(enc);
      return XML_TOK_INSTANCE_START;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S:
  case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2 * MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_GT:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n)                                                         \
      return XML_TOK_PARTIAL_CHAR;                                             \
    if (IS_INVALID_CHAR(enc, ptr, n)) {                                        \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_INVALID;                                                  \
    }                                                                          \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) {                                         \
      ptr += n;                                                                \
      tok = XML_TOK_NAME;                                                      \
      break;                                                                   \
    }                                                                          \
    if (IS_NAME_CHAR(enc, ptr, n)) {                                           \
      ptr += n;                                                                \
      tok = XML_TOK_NMTOKEN;                                                   \
      break;                                                                   \
    }                                                                          \
    *nextTokPtr = ptr;                                                         \
    return XML_TOK_INVALID;
    LEAD_CASE(2)
    LEAD_CASE(3)
    LEAD_CASE(4)
#  undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#  ifdef XML_NS
  case BT_COLON:
#  endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT:
    case BT_RPAR:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_LSQB:
    case BT_PERCNT:
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#  ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#  endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}